

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

bool __thiscall
helics::Federate::checkValidFilterType
          (Federate *this,bool useTypes,FilterTypes opType,string *operation)

{
  bool bVar1;
  InvalidParameter *pIVar2;
  undefined7 in_register_00000031;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view fmt;
  string_view message_02;
  string_view message_03;
  string_view fmt_00;
  string_view message_04;
  format_args args;
  format_args args_00;
  string emessage;
  pointer local_28;
  size_type sStack_20;
  
  if ((int)CONCAT71(in_register_00000031,useTypes) == 0) {
    if (opType != UNRECOGNIZED) {
      return true;
    }
    if (this->strictConfigChecking == true) {
      local_28 = (operation->_M_dataplus)._M_p;
      sStack_20 = operation->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x20;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_28;
      ::fmt::v11::vformat_abi_cxx11_
                (&emessage,(v11 *)"unrecognized filter operation:{}",fmt_00,args_00);
      message_04._M_str = emessage._M_dataplus._M_p;
      message_04._M_len = emessage._M_string_length;
      logMessage(this,0,message_04);
      pIVar2 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message_00._M_str = emessage._M_dataplus._M_p;
      message_00._M_len = emessage._M_string_length;
      InvalidParameter::InvalidParameter(pIVar2,message_00);
      __cxa_throw(pIVar2,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    local_28 = (operation->_M_dataplus)._M_p;
    sStack_20 = operation->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_28;
    ::fmt::v11::vformat_abi_cxx11_(&emessage,(v11 *)"unrecognized filter operation:{}",fmt,args);
    message_02._M_str = emessage._M_dataplus._M_p;
    message_02._M_len = emessage._M_string_length;
    logMessage(this,3,message_02);
    std::__cxx11::string::~string((string *)&emessage);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            operation,"custom");
    if (bVar1) {
      return true;
    }
    if (this->strictConfigChecking == true) {
      message_03._M_str = "input and output types may only be specified for custom filters";
      message_03._M_len = 0x3f;
      logMessage(this,0,message_03);
      pIVar2 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message._M_str = "input and output types may only be specified for custom filters";
      message._M_len = 0x3f;
      InvalidParameter::InvalidParameter(pIVar2,message);
      __cxa_throw(pIVar2,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    message_01._M_str = "input and output types may only be specified for custom filters";
    message_01._M_len = 0x3f;
    logMessage(this,3,message_01);
  }
  return false;
}

Assistant:

bool Federate::checkValidFilterType(bool useTypes,
                                    FilterTypes opType,
                                    const std::string& operation) const
{
    if ((useTypes) && (operation != "custom")) {
        if (strictConfigChecking) {
            logMessage(HELICS_LOG_LEVEL_ERROR,
                       "input and output types may only be specified for custom filters");
            throw(InvalidParameter(
                "input and output types may only be specified for custom filters"));
        }
        logMessage(HELICS_LOG_LEVEL_WARNING,
                   "input and output types may only be specified for custom filters");
        return false;
    }
    if (!useTypes) {
        if (opType == FilterTypes::UNRECOGNIZED) {
            if (strictConfigChecking) {
                const std::string emessage =
                    fmt::format("unrecognized filter operation:{}", operation);
                logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                throw(InvalidParameter(emessage));
            }
            logMessage(HELICS_LOG_LEVEL_WARNING,
                       fmt::format("unrecognized filter operation:{}", operation));
            return false;
        }
    }
    return true;
}